

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

TestCaseGroup *
deqp::egl::Image::createSimpleCreationTests(EglTestContext *eglTestCtx,string *name,string *desc)

{
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0xc88);
  SimpleCreationTests::SimpleCreationTests((SimpleCreationTests *)this,eglTestCtx,name,desc);
  return this;
}

Assistant:

TestCaseGroup* createSimpleCreationTests (EglTestContext& eglTestCtx, const string& name, const string& desc)
{
	return new SimpleCreationTests(eglTestCtx, name, desc);
}